

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::SwiftGetVersionCommand::execute
          (SwiftGetVersionCommand *this,BuildSystem *param_1,TaskInterface ti,
          QueueJobContext *context,ResultFn *resultFn)

{
  char *pcVar1;
  raw_ostream *prVar2;
  FILE *pFVar3;
  StringRef SVar4;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  ArrayRef<llbuild::basic::FileInfo> *local_2340;
  CommandSignature local_2308;
  undefined1 local_2300 [80];
  ArrayRef<llbuild::basic::FileInfo> local_22b0;
  BuildValue local_22a0;
  StringRef local_2230;
  size_t local_2220;
  ssize_t numRead;
  char buf [4096];
  SmallString<4096U> result;
  string local_1f8;
  FILE *local_1d8;
  FILE *fp;
  string local_1c0;
  undefined1 local_1a0 [8];
  raw_svector_ostream commandOS;
  SmallString<256U> command;
  ResultFn *resultFn_local;
  QueueJobContext *context_local;
  BuildSystem *param_1_local;
  SwiftGetVersionCommand *this_local;
  TaskInterface ti_local;
  
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)&commandOS.OS);
  llvm::raw_svector_ostream::raw_svector_ostream
            ((raw_svector_ostream *)local_1a0,(SmallVectorImpl<char> *)&commandOS.OS);
  fp = (FILE *)std::__cxx11::string::data();
  pcVar1 = (char *)std::__cxx11::string::length();
  SVar4.Length = (size_t)pcVar1;
  SVar4.Data = pcVar1;
  llbuild::basic::shellEscaped_abi_cxx11_(&local_1c0,(basic *)fp,SVar4);
  llvm::raw_ostream::operator<<((raw_ostream *)local_1a0,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)local_1a0," ");
  llvm::raw_ostream::operator<<(prVar2,"--version");
  prVar2 = llvm::raw_ostream::operator<<((raw_ostream *)local_1a0," ");
  llvm::raw_ostream::operator<<(prVar2,"2>/dev/null");
  join_0x00000010_0x00000000_ = llvm::raw_svector_ostream::str((raw_svector_ostream *)local_1a0);
  llvm::StringRef::str_abi_cxx11_
            (&local_1f8,
             (StringRef *)
             (result.super_SmallVector<char,_4096U>.super_SmallVectorStorage<char,_4096U>.InlineElts
             + 0xff8));
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pFVar3 = llbuild::basic::sys::popen(pcVar1,"r");
  std::__cxx11::string::~string((string *)&local_1f8);
  local_1d8 = pFVar3;
  llvm::SmallString<4096U>::SmallString((SmallString<4096U> *)(buf + 0xff8));
  if (local_1d8 != (FILE *)0x0) {
    while (local_2220 = fread(&numRead,1,0x1000,local_1d8), local_2220 != 0) {
      local_2230.Data = (char *)&numRead;
      local_2230.Length = local_2220;
      llvm::SmallString<4096U>::append((SmallString<4096U> *)(buf + 0xff8),local_2230);
    }
    llbuild::basic::sys::pclose(local_1d8);
  }
  local_2300._0_8_ = 0;
  local_2300._8_8_ = 0;
  local_2300._16_8_ = 0;
  local_2300._24_8_ = 0;
  local_2300._32_8_ = 0;
  local_2300._40_8_ = 0;
  local_2300[0x30] = '\0';
  local_2340 = (ArrayRef<llbuild::basic::FileInfo> *)(local_2300 + 0x31);
  do {
    *(undefined1 *)&local_2340->Data = 0;
    local_2340 = (ArrayRef<llbuild::basic::FileInfo> *)((long)&local_2340->Data + 1);
  } while (local_2340 != &local_22b0);
  llvm::ArrayRef<llbuild::basic::FileInfo>::ArrayRef(&local_22b0,(FileInfo *)local_2300);
  SVar4 = llvm::SmallString::operator_cast_to_StringRef((SmallString *)(buf + 0xff8));
  llbuild::basic::CommandSignature::CommandSignature(&local_2308,SVar4);
  outputInfos.Length = local_2308.value;
  outputInfos.Data = (FileInfo *)local_22b0.Length;
  llbuild::buildsystem::BuildValue::makeSuccessfulCommandWithOutputSignature
            (&local_22a0,(BuildValue *)local_22b0.Data,outputInfos,(CommandSignature)context);
  std::function<void_(llbuild::buildsystem::BuildValue_&&)>::operator()(resultFn,&local_22a0);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_22a0);
  llvm::SmallString<4096U>::~SmallString((SmallString<4096U> *)(buf + 0xff8));
  llvm::raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_1a0);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)&commandOS.OS);
  return;
}

Assistant:

virtual void execute(BuildSystem&,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // Construct the command line used to query the swift compiler version.
    //
    // FIXME: Need a decent subprocess interface.
    SmallString<256> command;
    llvm::raw_svector_ostream commandOS(command);
    commandOS << basic::shellEscaped(executable);
    commandOS << " " << "--version";
#if defined(_WIN32)
    // FIXME:  cmd.exe uses different syntax for I/O redirection to null.
    commandOS << " 2>NUL";
#else
    commandOS << " " << "2>/dev/null";
#endif

    // Read the result.
    FILE *fp = basic::sys::popen(commandOS.str().str().c_str(), "r");
    SmallString<4096> result;
    if (fp) {
      char buf[4096];
      for (;;) {
        ssize_t numRead = fread(buf, 1, sizeof(buf), fp);
        if (numRead == 0) {
          // FIXME: Error handling.
          break;
        }
        result.append(StringRef(buf, numRead));
      }
      basic::sys::pclose(fp);
    }

    // For now, we can get away with just encoding this as a successful
    // command and relying on the signature to detect changes.
    //
    // FIXME: We should support BuildValues with arbitrary payloads.
    resultFn(BuildValue::makeSuccessfulCommandWithOutputSignature(
       basic::FileInfo{}, CommandSignature(result)));
  }